

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,_ *param_2,Maybe<unsigned_int> *param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  _ *params;
  int *value;
  CappedArray<char,_14UL> local_50;
  String local_38;
  _ *local_20;
  DebugComparison<kj::Maybe<unsigned_int>,_int> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::Maybe<unsigned_int>,kj::String>(&local_38,param_2,param_3);
  params = local_20 + 0x10;
  tryToCharSequence<int,kj::CappedArray<char,14ul>>(&local_50,local_20 + 8,value);
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_38,(String *)params,(StringPtr *)&local_50,param_5);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}